

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
ctemplate::BaseArena::GetMemoryWithHandle(BaseArena *this,size_t size,Handle *handle)

{
  char *pcVar1;
  ulong local_48;
  uint64 handle_value;
  uint64 offset;
  AllocatedBlock *block;
  int block_index;
  void *p;
  Handle *handle_local;
  size_t size_local;
  BaseArena *this_local;
  
  if (handle == (Handle *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","handle != NULL");
    exit(1);
  }
  pcVar1 = (char *)GetMemory(this,size,1 << ((byte)this->handle_alignment_bits_ & 0x1f));
  offset = 0;
  block._4_4_ = block_count(this);
  do {
    block._4_4_ = block._4_4_ + -1;
    if (block._4_4_ < 0) break;
    offset = (uint64)IndexToBlock(this,block._4_4_);
  } while ((pcVar1 < ((AllocatedBlock *)offset)->mem) ||
          (((AllocatedBlock *)offset)->mem + ((AllocatedBlock *)offset)->size <= pcVar1));
  if (block._4_4_ < 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","block_index",">=","0");
    exit(1);
  }
  if (offset != 0) {
    local_48 = (ulong)(pcVar1 + (((long)block._4_4_ << ((byte)this->block_size_bits_ & 0x3f)) -
                                *(long *)offset)) >> ((byte)this->handle_alignment_bits_ & 0x3f);
    if (0xfffffffe < local_48) {
      local_48 = 0xffffffff;
    }
    *(int *)handle = (int)local_48;
    return pcVar1;
  }
  fprintf(_stderr,"Check failed: %s\n","block != NULL");
  exit(1);
}

Assistant:

void* BaseArena::GetMemoryWithHandle(
    const size_t size, BaseArena::Handle* handle) {
  CHECK(handle != NULL);
  // For efficiency, handles are always allocated aligned to a power of 2.
  void* p = GetMemory(size, (1 << handle_alignment_bits_));
  // Find the index of the block the memory was allocated from. In most
  // cases, this will be the last block, so the following loop will
  // iterate exactly once.
  int block_index;
  const AllocatedBlock* block = NULL;
  for (block_index = block_count() - 1; block_index >= 0; --block_index) {
    block = IndexToBlock(block_index);
    if ((p >= block->mem) && (p < (block->mem + block->size))) {
      break;
    }
  }
  CHECK_GE(block_index, 0) << "Failed to find block that was allocated from";
  CHECK(block != NULL) << "Failed to find block that was allocated from";
  const uint64 offset = reinterpret_cast<char*>(p) - block->mem;
  DCHECK_LT(offset, block_size_);
  DCHECK((offset & ((1 << handle_alignment_bits_) - 1)) == 0);
  DCHECK((block_size_ & ((1 << handle_alignment_bits_) - 1)) == 0);
  uint64 handle_value =
      ((static_cast<uint64>(block_index) << block_size_bits_) + offset) >>
      handle_alignment_bits_;
  if (handle_value >= static_cast<uint64>(0xFFFFFFFF)) {
    // We ran out of space to be able to return a handle, so return an invalid
    // handle.
    handle_value = Handle::kInvalidValue;
  }
  handle->handle_ = static_cast<uint32>(handle_value);
  return p;
}